

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

Value * duckdb::GetCumulativeOptimizers(Value *__return_storage_ptr__,ProfilingNode *node)

{
  bool bVar1;
  _Hash_node_base *p_Var2;
  double dVar3;
  double local_18;
  
  p_Var2 = (node->profiling_info).metrics._M_h._M_before_begin._M_nxt;
  if (p_Var2 == (_Hash_node_base *)0x0) {
    local_18 = 0.0;
  }
  else {
    local_18 = 0.0;
    do {
      bVar1 = MetricsUtils::IsOptimizerMetric(*(MetricsType *)&p_Var2[1]._M_nxt);
      if (bVar1) {
        dVar3 = Value::GetValue<double>((Value *)(p_Var2 + 2));
        local_18 = local_18 + dVar3;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  Value::CreateValue<double>(__return_storage_ptr__,local_18);
  return __return_storage_ptr__;
}

Assistant:

Value GetCumulativeOptimizers(ProfilingNode &node) {
	auto &metrics = node.GetProfilingInfo().metrics;
	double count = 0;
	for (auto &metric : metrics) {
		if (MetricsUtils::IsOptimizerMetric(metric.first)) {
			count += metric.second.GetValue<double>();
		}
	}
	return Value::CreateValue(count);
}